

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

void Bdc_SpfdDecomposeTest(void)

{
  int iVar1;
  Vec_Wrd_t *p;
  word wVar2;
  Vec_Wrd_t *p_00;
  abctime aVar3;
  abctime aVar4;
  word wVar5;
  abctime clk;
  int local_30;
  int Counter;
  int k;
  int i;
  int EntryK;
  int EntryM;
  Vec_Wrd_t *v1K;
  Vec_Wrd_t *v1M;
  int nSizeK;
  int nSizeM;
  
  Aig_ManRandom64(1);
  p = Vec_WrdAlloc(0x4000000);
  for (Counter = 0; Counter < 0x4000000; Counter = Counter + 1) {
    wVar2 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar2);
  }
  p_00 = Vec_WrdAlloc(8);
  for (Counter = 0; Counter < 8; Counter = Counter + 1) {
    wVar2 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar2);
  }
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  for (Counter = 0; iVar1 = Vec_WrdSize(p), Counter < iVar1; Counter = Counter + 1) {
    wVar2 = Vec_WrdEntry(p,Counter);
    for (local_30 = 0; iVar1 = Vec_WrdSize(p_00), local_30 < iVar1; local_30 = local_30 + 1) {
      wVar5 = Vec_WrdEntry(p_00,local_30);
      clk._4_4_ = (((uint)wVar2 & (uint)wVar5) == (uint)wVar5) + clk._4_4_;
    }
  }
  printf("Total = %8d.  ",(ulong)clk._4_4_);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  for (local_30 = 0; iVar1 = Vec_WrdSize(p_00), local_30 < iVar1; local_30 = local_30 + 1) {
    wVar2 = Vec_WrdEntry(p_00,local_30);
    for (Counter = 0; iVar1 = Vec_WrdSize(p), Counter < iVar1; Counter = Counter + 1) {
      wVar5 = Vec_WrdEntry(p,Counter);
      clk._4_4_ = (((uint)wVar5 & (uint)wVar2) == (uint)wVar2) + clk._4_4_;
    }
  }
  printf("Total = %8d.  ",(ulong)clk._4_4_);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest()
{
  int nSizeM = (1 << 26);  // big array size
  int nSizeK = (1 << 3);   // small array size
  Vec_Wrd_t * v1M, * v1K;
  int EntryM, EntryK;
  int i, k, Counter;
  abctime clk;

  Aig_ManRandom64( 1 );

  v1M = Vec_WrdAlloc( nSizeM );
  for ( i = 0; i < nSizeM; i++ )
      Vec_WrdPush( v1M, Aig_ManRandom64(0) );

  v1K = Vec_WrdAlloc( nSizeK );
  for ( i = 0; i < nSizeK; i++ )
      Vec_WrdPush( v1K, Aig_ManRandom64(0) );

  clk = Abc_Clock();
  Counter = 0;
//  for ( i = 0; i < nSizeM; i++ )
//  for ( k = 0; k < nSizeK; k++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1M, EntryM, i )
  Vec_WrdForEachEntry( v1K, EntryK, k )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

  clk = Abc_Clock();
  Counter = 0;
//  for ( k = 0; k < nSizeK; k++ )
//  for ( i = 0; i < nSizeM; i++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1K, EntryK, k )
  Vec_WrdForEachEntry( v1M, EntryM, i )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}